

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void JSON::writeNext(Pipeline *p,bool *first,size_t depth)

{
  string s;
  string local_38;
  
  if (*first == true) {
    *first = false;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"\n","");
    std::__cxx11::string::_M_replace_aux
              ((ulong)&local_38,local_38._M_string_length,0,(char)depth * '\x02');
    Pipeline::operator<<(p,&local_38);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,",\n","");
    std::__cxx11::string::_M_replace_aux
              ((ulong)&local_38,local_38._M_string_length,0,(char)depth * '\x02');
    Pipeline::operator<<(p,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
JSON::writeNext(Pipeline* p, bool& first, size_t depth)
{
    if (first) {
        first = false;
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s;
    } else {
        std::string s{",\n"};
        s.append(2 * depth, ' ');
        *p << s;
    }
}